

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBarcodeValue.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
ZXing::Pdf417::BarcodeValue::value(BarcodeValue *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> this_00;
  pointer ppVar2;
  type *ptVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  type *count;
  type *value;
  const_iterator __end3;
  const_iterator __begin3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  int maxConfidence;
  vector<int,_std::allocator<int>_> *result;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *__x;
  _Self local_60;
  _Self local_58 [5];
  _Base_ptr local_30;
  _Base_ptr local_28;
  _Base_ptr local_20;
  int local_18;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2b8aae);
  bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x2b8ab8);
  if (!bVar1) {
    local_28 = (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               begin(in_stack_ffffffffffffff68);
    local_30 = (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         (in_stack_ffffffffffffff68);
    this_00 = std::
              max_element<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,ZXing::Pdf417::BarcodeValue::value()const::__0>
                        (local_28,local_30);
    local_20 = this_00._M_node;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x2b8b06);
    local_18 = ppVar2->second;
    local_58[0]._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (this_00._M_node);
    local_60._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (this_00._M_node);
    while (bVar1 = std::operator!=(local_58,&local_60), bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*
                ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x2b8b5a);
      std::get<0ul,int_const,int>((pair<const_int,_int> *)0x2b8b6c);
      ptVar3 = std::get<1ul,int_const,int>((pair<const_int,_int> *)0x2b8b7b);
      if (*ptVar3 == local_18) {
        std::vector<int,_std::allocator<int>_>::push_back(in_RSI,(value_type_conflict3 *)__x);
      }
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)in_RDI);
    }
  }
  return __x;
}

Assistant:

std::vector<int>
BarcodeValue::value() const
{
	std::vector<int> result;
	if (!_values.empty()) {
		int maxConfidence = std::max_element(_values.begin(), _values.end(), [](auto& l, auto& r) { return l.second < r.second; })->second;
		for (auto [value, count] : _values)
			if (count == maxConfidence)
				result.push_back(value);
	}
	return result;
}